

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O1

pair<HighsImplications::VarBound_*,_bool>
HighsHashTree<int,_HighsImplications::VarBound>::insert_recurse
          (NodePtr *insertNode,uint64_t hash,int hashPos,
          HighsHashTableEntry<int,_HighsImplications::VarBound> *entry)

{
  int *piVar1;
  char *pcVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  byte bVar6;
  double dVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  InnerLeaf<1> *this;
  ValueType *pVVar10;
  ulong *puVar11;
  undefined8 *puVar12;
  int iVar13;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar14;
  int hashPos_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  int i;
  ulong uVar15;
  undefined8 *puVar16;
  VarBound *pVVar17;
  long lVar18;
  ulong uVar19;
  Entry *pEVar20;
  long lVar21;
  VarBound *pVVar22;
  array<HighsHashTableEntry<int,_HighsImplications::VarBound>,_54UL> *paVar23;
  BranchNode *branch;
  InnerLeaf<4> *this_00;
  pair<HighsImplications::VarBound_*,_bool> pVar24;
  pair<HighsImplications::VarBound_*,_bool> pVar25;
  array<unsigned_char,_55UL> sizes;
  undefined8 local_70;
  byte local_68 [56];
  
  uVar15 = insertNode->ptrAndType;
  switch((uint)uVar15 & 7) {
  case 0:
    if (hashPos == 9) {
      puVar12 = (undefined8 *)operator_new(0x28);
      *puVar12 = 0;
      dVar7 = (entry->value_).coef;
      puVar12[1] = *(undefined8 *)entry;
      puVar12[2] = dVar7;
      puVar12[3] = (entry->value_).constant;
      *(undefined4 *)(puVar12 + 4) = 1;
      insertNode->ptrAndType = (ulong)puVar12 | 1;
      pVar25._9_7_ = (int7)((ulong)extraout_RDX >> 8);
      pVar25.second = true;
      pVar25.first = (VarBound *)(puVar12 + 2);
    }
    else {
      this = (InnerLeaf<1> *)operator_new(0xd8);
      (this->occupation).occupation = 0;
      this->size = 0;
      (this->hashes)._M_elems[0] = 0;
      insertNode->ptrAndType = (ulong)this | 2;
      pVar25 = InnerLeaf<1>::insert_entry(this,hash,hashPos,entry);
    }
    break;
  case 1:
    puVar12 = (undefined8 *)(uVar15 & 0xfffffffffffffff8);
    do {
      puVar16 = puVar12;
      if (*(int *)(puVar16 + 1) == entry->key_) {
        uVar14 = 0;
        goto LAB_002ab86f;
      }
      puVar12 = (undefined8 *)*puVar16;
    } while ((undefined8 *)*puVar16 != (undefined8 *)0x0);
    puVar12 = (undefined8 *)operator_new(0x20);
    *puVar12 = 0;
    dVar7 = (entry->value_).coef;
    puVar12[1] = *(undefined8 *)entry;
    puVar12[2] = dVar7;
    puVar12[3] = (entry->value_).constant;
    *puVar16 = puVar12;
    piVar1 = (int *)((undefined8 *)(uVar15 & 0xfffffffffffffff8) + 4);
    *piVar1 = *piVar1 + 1;
    uVar14 = CONCAT71((int7)((ulong)extraout_RDX_00 >> 8),1);
    puVar16 = puVar12;
LAB_002ab86f:
    pVar25._8_8_ = uVar14;
    pVar25.first = (VarBound *)(puVar16 + 2);
    break;
  case 2:
    pVar25 = insert_into_leaf<1>(insertNode,(InnerLeaf<1> *)(uVar15 & 0xfffffffffffffff8),hash,
                                 hashPos,entry);
    break;
  case 3:
    pVar25 = insert_into_leaf<2>(insertNode,(InnerLeaf<2> *)(uVar15 & 0xfffffffffffffff8),hash,
                                 hashPos,entry);
    break;
  case 4:
    pVar25 = insert_into_leaf<3>(insertNode,(InnerLeaf<3> *)(uVar15 & 0xfffffffffffffff8),hash,
                                 hashPos,entry);
    break;
  case 5:
    this_00 = (InnerLeaf<4> *)(uVar15 & 0xfffffffffffffff8);
    if (this_00->size < 0x36) {
      pVar24 = InnerLeaf<4>::insert_entry(this_00,hash,hashPos,entry);
      bVar4 = true;
    }
    else {
      pVVar10 = InnerLeaf<4>::find_entry(this_00,hash,hashPos,&entry->key_);
      if (pVVar10 == (ValueType *)0x0) {
        local_70 = (ulong)((uint)(hash >> ((char)hashPos * -6 + 0x3aU & 0x3f)) & 0x3f);
        uVar15 = (this_00->occupation).occupation | 1L << local_70;
        pVVar22 = (VarBound *)POPCOUNT(uVar15);
        uVar5 = (uint)pVVar22;
        puVar11 = (ulong *)operator_new((ulong)(uVar5 * 8 + 0x47 & 0xffffffc0));
        *puVar11 = 0;
        insertNode->ptrAndType = (ulong)puVar11 | 6;
        *puVar11 = uVar15;
        hashPos_00 = hashPos + 1;
        if (hashPos_00 == 9) {
          memset(puVar11 + 1,0,(ulong)((uVar5 + (pVVar22 == (VarBound *)0x0)) * 8));
          if (0 < this_00->size) {
            paVar23 = &this_00->entries;
            lVar21 = 0;
            do {
              lVar18 = POPCOUNT(uVar15 >> ((byte)((uint)(this_00->hashes)._M_elems[lVar21] >> 10) &
                                          0x3f));
              if ((puVar11[lVar18] & 7) == 0) {
                puVar12 = (undefined8 *)operator_new(0x28);
                *puVar12 = 0;
                dVar7 = paVar23->_M_elems[0].value_.coef;
                puVar12[1] = *(undefined8 *)paVar23->_M_elems;
                puVar12[2] = dVar7;
                puVar12[3] = paVar23->_M_elems[0].value_.constant;
                *(undefined4 *)(puVar12 + 4) = 1;
                puVar11[lVar18] = (ulong)puVar12 | 1;
              }
              else {
                puVar16 = (undefined8 *)(puVar11[lVar18] & 0xfffffffffffffff8);
                puVar12 = (undefined8 *)operator_new(0x20);
                uVar14 = *puVar16;
                uVar8 = puVar16[1];
                uVar9 = puVar16[3];
                puVar12[2] = puVar16[2];
                puVar12[3] = uVar9;
                *puVar12 = uVar14;
                puVar12[1] = uVar8;
                *puVar16 = puVar12;
                puVar16[3] = paVar23->_M_elems[0].value_.constant;
                dVar7 = paVar23->_M_elems[0].value_.coef;
                puVar16[1] = *(undefined8 *)paVar23->_M_elems;
                puVar16[2] = dVar7;
                *(int *)(puVar16 + 4) = *(int *)(puVar16 + 4) + 1;
              }
              lVar21 = lVar21 + 1;
              paVar23 = (array<HighsHashTableEntry<int,_HighsImplications::VarBound>,_54UL> *)
                        (paVar23->_M_elems + 1);
            } while (lVar21 < this_00->size);
          }
          operator_delete(this_00);
          lVar21 = POPCOUNT(uVar15 >> ((byte)local_70 & 0x3f));
          if ((puVar11[lVar21] & 7) == 0) {
            puVar12 = (undefined8 *)operator_new(0x28);
            *puVar12 = 0;
            dVar7 = (entry->value_).coef;
            puVar12[1] = *(undefined8 *)entry;
            puVar12[2] = dVar7;
            puVar12[3] = (entry->value_).constant;
            *(undefined4 *)(puVar12 + 4) = 1;
            puVar11[lVar21] = (ulong)puVar12 | 1;
            uVar14 = extraout_RDX_03;
          }
          else {
            puVar12 = (undefined8 *)(puVar11[lVar21] & 0xfffffffffffffff8);
            puVar16 = (undefined8 *)operator_new(0x20);
            uVar14 = *puVar12;
            uVar8 = puVar12[1];
            uVar9 = puVar12[3];
            puVar16[2] = puVar12[2];
            puVar16[3] = uVar9;
            *puVar16 = uVar14;
            puVar16[1] = uVar8;
            *puVar12 = puVar16;
            puVar12[3] = (entry->value_).constant;
            dVar7 = (entry->value_).coef;
            puVar12[1] = *(undefined8 *)entry;
            puVar12[2] = dVar7;
            *(int *)(puVar12 + 4) = *(int *)(puVar12 + 4) + 1;
            uVar14 = extraout_RDX_01;
          }
          bVar4 = true;
          pVar24._9_7_ = (int7)((ulong)uVar14 >> 8);
          pVar24.second = true;
          pVar24.first = (VarBound *)(puVar12 + 2);
        }
        else if (uVar5 < 2) {
          insertNode = (NodePtr *)(puVar11 + 1);
          puVar11[1] = (ulong)this_00 | 5;
          InnerLeaf<4>::rehash(this_00,hashPos_00);
          pVar24._8_8_ = extraout_RDX_02;
          pVar24.first = pVVar22;
          bVar4 = false;
          hashPos = hashPos_00;
        }
        else {
          uVar3 = this_00->size;
          iVar13 = (uVar3 - uVar5) + 2;
          bVar4 = iVar13 < 7;
          if (SBORROW4(iVar13,7) == (int)((uVar3 - uVar5) + -5) < 0) {
            local_68[0x20] = 0;
            local_68[0x21] = 0;
            local_68[0x22] = 0;
            local_68[0x23] = 0;
            local_68[0x24] = 0;
            local_68[0x25] = 0;
            local_68[0x26] = 0;
            local_68[0x27] = 0;
            local_68[0x28] = 0;
            local_68[0x29] = 0;
            local_68[0x2a] = 0;
            local_68[0x2b] = 0;
            local_68[0x2c] = 0;
            local_68[0x2d] = 0;
            local_68[0x2e] = 0;
            local_68[0x10] = 0;
            local_68[0x11] = 0;
            local_68[0x12] = 0;
            local_68[0x13] = 0;
            local_68[0x14] = 0;
            local_68[0x15] = 0;
            local_68[0x16] = 0;
            local_68[0x17] = 0;
            local_68[0x18] = 0;
            local_68[0x19] = 0;
            local_68[0x1a] = 0;
            local_68[0x1b] = 0;
            local_68[0x1c] = 0;
            local_68[0x1d] = 0;
            local_68[0x1e] = 0;
            local_68[0x1f] = 0;
            local_68[0] = 0;
            local_68[1] = 0;
            local_68[2] = 0;
            local_68[3] = 0;
            local_68[4] = 0;
            local_68[5] = 0;
            local_68[6] = 0;
            local_68[7] = 0;
            local_68[8] = 0;
            local_68[9] = 0;
            local_68[10] = 0;
            local_68[0xb] = 0;
            local_68[0xc] = 0;
            local_68[0xd] = 0;
            local_68[0xe] = 0;
            local_68[0xf] = 0;
            local_68[0x2f] = 0;
            local_68[0x30] = 0;
            local_68[0x31] = 0;
            local_68[0x32] = 0;
            local_68[0x33] = 0;
            local_68[0x34] = 0;
            local_68[0x35] = 0;
            local_68[0x36] = 0;
            lVar21 = POPCOUNT(uVar15 >> ((byte)local_70 & 0x3f));
            pcVar2 = (char *)((long)&local_70 + lVar21 + 7);
            *pcVar2 = *pcVar2 + '\x01';
            if (0 < (int)uVar3) {
              uVar19 = 0;
              do {
                pcVar2 = (char *)((long)&local_70 +
                                 POPCOUNT(uVar15 >> ((byte)((uint)(this_00->hashes)._M_elems[uVar19]
                                                           >> 10) & 0x3f)) + 7);
                *pcVar2 = *pcVar2 + '\x01';
                uVar19 = uVar19 + 1;
              } while (uVar3 != uVar19);
            }
            pVVar17 = (VarBound *)(ulong)(uVar5 + (uVar5 == 0));
            pVVar22 = (VarBound *)0x0;
            do {
              switch(local_68[(long)pVVar22] + 9 >> 4) {
              case 0:
                puVar12 = (undefined8 *)operator_new(0xd8);
                uVar19 = 2;
                break;
              case 1:
                puVar12 = (undefined8 *)operator_new(0x2d8);
                uVar19 = 3;
                break;
              case 2:
                puVar12 = (undefined8 *)operator_new(0x4d8);
                uVar19 = 4;
                break;
              case 3:
                puVar12 = (undefined8 *)operator_new(0x6d8);
                uVar19 = 5;
                break;
              default:
                goto switchD_002abd27_default;
              }
              *puVar12 = 0;
              *(undefined4 *)(puVar12 + 1) = 0;
              puVar12[2] = 0;
              puVar11[(long)((long)&pVVar22->coef + 1)] = uVar19 | (ulong)puVar12;
switchD_002abd27_default:
              pVVar22 = (VarBound *)((long)&pVVar22->coef + 1);
            } while (pVVar17 != pVVar22);
            if (0 < this_00->size) {
              pEVar20 = (this_00->entries)._M_elems;
              pVVar17 = (VarBound *)0x0;
              do {
                uVar19 = puVar11[POPCOUNT(uVar15 >> ((byte)((uint)(this_00->hashes)._M_elems
                                                                  [(long)pVVar17] >> 10) & 0x3f))];
                switch((uint)uVar19 & 7) {
                case 2:
                  InnerLeaf<1>::insert_entry
                            ((InnerLeaf<1> *)(uVar19 & 0xfffffffffffffff8),
                             (ulong)(uint)pEVar20->key_ * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3
                             >> 0x20 ^ (ulong)(uint)pEVar20->key_ * -0x75e7c76a1153eaca +
                                       0x1da24fc66dd63e32,hashPos_00,pEVar20);
                  break;
                case 3:
                  InnerLeaf<2>::insert_entry
                            ((InnerLeaf<2> *)(uVar19 & 0xfffffffffffffff8),
                             (ulong)(uint)pEVar20->key_ * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3
                             >> 0x20 ^ (ulong)(uint)pEVar20->key_ * -0x75e7c76a1153eaca +
                                       0x1da24fc66dd63e32,hashPos_00,pEVar20);
                  break;
                case 4:
                  InnerLeaf<3>::insert_entry
                            ((InnerLeaf<3> *)(uVar19 & 0xfffffffffffffff8),
                             (ulong)(uint)pEVar20->key_ * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3
                             >> 0x20 ^ (ulong)(uint)pEVar20->key_ * -0x75e7c76a1153eaca +
                                       0x1da24fc66dd63e32,hashPos_00,pEVar20);
                  break;
                case 5:
                  InnerLeaf<4>::insert_entry
                            ((InnerLeaf<4> *)(uVar19 & 0xfffffffffffffff8),
                             (ulong)(uint)pEVar20->key_ * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3
                             >> 0x20 ^ (ulong)(uint)pEVar20->key_ * -0x75e7c76a1153eaca +
                                       0x1da24fc66dd63e32,hashPos_00,pEVar20);
                }
                pVVar17 = (VarBound *)((long)&pVVar17->coef + 1);
                pEVar20 = pEVar20 + 1;
              } while ((long)pVVar17 < (long)this_00->size);
            }
            operator_delete(this_00);
            pVar24._8_8_ = extraout_RDX_04;
            pVar24.first = pVVar17;
            insertNode = (NodePtr *)(puVar11 + lVar21);
            hashPos = hashPos_00;
          }
          else {
            pVVar17 = (VarBound *)0x0;
            do {
              puVar12 = (undefined8 *)operator_new(0xd8);
              *puVar12 = 0;
              *(undefined4 *)(puVar12 + 1) = 0;
              puVar12[2] = 0;
              puVar11[(long)((long)&pVVar17->coef + 1)] = (ulong)puVar12 | 2;
              pVVar17 = (VarBound *)((long)&pVVar17->coef + 1);
            } while (pVVar22 != pVVar17);
            if (0 < this_00->size) {
              pEVar20 = (this_00->entries)._M_elems;
              lVar21 = 0;
              do {
                InnerLeaf<1>::insert_entry
                          ((InnerLeaf<1> *)
                           (puVar11[POPCOUNT(uVar15 >> ((byte)((uint)(this_00->hashes)._M_elems
                                                                     [lVar21] >> 10) & 0x3f))] &
                           0xfffffffffffffff8),
                           (ulong)(uint)pEVar20->key_ * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >>
                           0x20 ^ (ulong)(uint)pEVar20->key_ * -0x75e7c76a1153eaca +
                                  0x1da24fc66dd63e32,hashPos_00,pEVar20);
                lVar21 = lVar21 + 1;
                pEVar20 = pEVar20 + 1;
              } while (lVar21 < this_00->size);
            }
            operator_delete(this_00);
            pVar24 = InnerLeaf<1>::insert_entry
                               ((InnerLeaf<1> *)
                                (puVar11[POPCOUNT(uVar15 >> ((byte)local_70 & 0x3f))] &
                                0xfffffffffffffff8),hash,hashPos_00,entry);
          }
        }
      }
      else {
        bVar4 = true;
        pVar24._8_8_ = 0;
        pVar24.first = pVVar10;
      }
    }
    if (bVar4) {
      return pVar24;
    }
  case 7:
switchD_002ab718_caseD_7:
    pVar25 = insert_recurse(insertNode,hash,hashPos,entry);
    break;
  case 6:
    uVar19 = hash >> ((char)hashPos * -6 + 0x3aU & 0x3f);
    branch = (BranchNode *)(uVar15 & 0xfffffffffffffff8);
    uVar15 = (branch->occupation).occupation;
    bVar6 = (byte)uVar19;
    lVar21 = POPCOUNT(uVar15 >> (bVar6 & 0x3f));
    if ((uVar15 >> (uVar19 & 0x3f) & 1) == 0) {
      branch = addChildToBranchNode(branch,bVar6 & 0x3f,(int)lVar21);
      branch->child[lVar21].ptrAndType = 0;
      (branch->occupation).occupation = (branch->occupation).occupation | 1L << (bVar6 & 0x3f);
    }
    else {
      lVar21 = lVar21 + -1;
    }
    insertNode->ptrAndType = (ulong)branch | 6;
    hashPos = hashPos + 1;
    insertNode = branch->child + lVar21;
    goto switchD_002ab718_caseD_7;
  }
  return pVar25;
}

Assistant:

static std::pair<ValueType*, bool> insert_recurse(
      NodePtr* insertNode, uint64_t hash, int hashPos,
      HighsHashTableEntry<K, V>& entry) {
    switch (insertNode->getType()) {
      case kEmpty: {
        if (hashPos == kMaxDepth) {
          ListLeaf* leaf = new ListLeaf(std::move(entry));
          *insertNode = leaf;
          return std::make_pair(&leaf->first.entry.value(), true);
        } else {
          InnerLeaf<1>* leaf = new InnerLeaf<1>;
          *insertNode = leaf;
          return leaf->insert_entry(hash, hashPos, entry);
        }
      }
      case kListLeaf: {
        ListLeaf* leaf = insertNode->getListLeaf();
        ListNode* iter = &leaf->first;
        while (true) {
          // check for existing key
          if (iter->entry.key() == entry.key())
            return std::make_pair(&iter->entry.value(), false);

          if (iter->next == nullptr) {
            // reached the end of the list and key is not duplicate, so insert
            iter->next = new ListNode(std::move(entry));
            ++leaf->count;
            return std::make_pair(&iter->next->entry.value(), true);
          }
          iter = iter->next;
        }

        break;
      }
      case kInnerLeafSizeClass1:
        return insert_into_leaf(insertNode,
                                insertNode->getInnerLeafSizeClass1(), hash,
                                hashPos, entry);
        break;
      case kInnerLeafSizeClass2:
        return insert_into_leaf(insertNode,
                                insertNode->getInnerLeafSizeClass2(), hash,
                                hashPos, entry);
        break;
      case kInnerLeafSizeClass3:
        return insert_into_leaf(insertNode,
                                insertNode->getInnerLeafSizeClass3(), hash,
                                hashPos, entry);
        break;
      case kInnerLeafSizeClass4: {
        InnerLeaf<4>* leaf = insertNode->getInnerLeafSizeClass4();
        if (leaf->size < InnerLeaf<4>::capacity())
          return leaf->insert_entry(hash, hashPos, entry);

        auto existingEntry = leaf->find_entry(hash, hashPos, entry.key());
        if (existingEntry) return std::make_pair(existingEntry, false);
        Occupation occupation = leaf->occupation;

        uint8_t hashChunk = get_hash_chunk(hash, hashPos);
        occupation.set(hashChunk);

        int branchSize = occupation.num_set();

        BranchNode* branch = createBranchingNode(branchSize);
        *insertNode = branch;
        branch->occupation = occupation;

        if (hashPos + 1 == kMaxDepth) {
          for (int i = 0; i < branchSize; ++i) branch->child[i] = nullptr;

          for (int i = 0; i < leaf->size; ++i) {
            int pos =
                occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                1;
            if (branch->child[pos].getType() == kEmpty)
              branch->child[pos] = new ListLeaf(std::move(leaf->entries[i]));
            else {
              ListLeaf* listLeaf = branch->child[pos].getListLeaf();
              ListNode* newNode = new ListNode(std::move(listLeaf->first));
              listLeaf->first.next = newNode;
              listLeaf->first.entry = std::move(leaf->entries[i]);
              ++listLeaf->count;
            }
          }

          delete leaf;

          ListLeaf* listLeaf;

          int pos = occupation.num_set_until(get_hash_chunk(hash, hashPos)) - 1;
          if (branch->child[pos].getType() == kEmpty) {
            listLeaf = new ListLeaf(std::move(entry));
            branch->child[pos] = listLeaf;
          } else {
            listLeaf = branch->child[pos].getListLeaf();
            ListNode* newNode = new ListNode(std::move(listLeaf->first));
            listLeaf->first.next = newNode;
            listLeaf->first.entry = std::move(entry);
            ++listLeaf->count;
          }

          return std::make_pair(&listLeaf->first.entry.value(), true);
        }

        if (branchSize > 1) {
          // maxsize in one bucket = number of items - (num buckets-1)
          // since each bucket has at least 1 item the largest one can only
          // have all remaining ones After adding the item: If it does not
          // collide
          int maxEntriesPerLeaf = 2 + leaf->size - branchSize;

          if (maxEntriesPerLeaf <= InnerLeaf<1>::capacity()) {
            // all items can go into the smallest leaf size
            for (int i = 0; i < branchSize; ++i)
              branch->child[i] = new InnerLeaf<1>;

            for (int i = 0; i < leaf->size; ++i) {
              int pos =
                  occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                  1;
              branch->child[pos].getInnerLeafSizeClass1()->insert_entry(
                  compute_hash(leaf->entries[i].key()), hashPos + 1,
                  leaf->entries[i]);
            }

            delete leaf;

            int pos =
                occupation.num_set_until(get_hash_chunk(hash, hashPos)) - 1;
            return branch->child[pos].getInnerLeafSizeClass1()->insert_entry(
                hash, hashPos + 1, entry);
          } else {
            // there are many collisions, determine the exact sizes first
            std::array<uint8_t, InnerLeaf<4>::capacity() + 1> sizes = {};
            sizes[occupation.num_set_until(hashChunk) - 1] += 1;
            for (int i = 0; i < leaf->size; ++i) {
              int pos =
                  occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                  1;
              sizes[pos] += 1;
            }

            for (int i = 0; i < branchSize; ++i) {
              switch (entries_to_size_class(sizes[i])) {
                case 1:
                  branch->child[i] = new InnerLeaf<1>;
                  break;
                case 2:
                  branch->child[i] = new InnerLeaf<2>;
                  break;
                case 3:
                  branch->child[i] = new InnerLeaf<3>;
                  break;
                case 4:
                  branch->child[i] = new InnerLeaf<4>;
                  break;
                default:
                  // Unexpected result from 'entries_to_size_class'
                  assert(false);
              }
            }

            for (int i = 0; i < leaf->size; ++i) {
              int pos =
                  occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                  1;

              switch (branch->child[pos].getType()) {
                case kInnerLeafSizeClass1:
                  branch->child[pos].getInnerLeafSizeClass1()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                case kInnerLeafSizeClass2:
                  branch->child[pos].getInnerLeafSizeClass2()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                case kInnerLeafSizeClass3:
                  branch->child[pos].getInnerLeafSizeClass3()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                case kInnerLeafSizeClass4:
                  branch->child[pos].getInnerLeafSizeClass4()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                default:
                  break;
              }
            }
          }

          delete leaf;

          int pos = occupation.num_set_until(hashChunk) - 1;
          insertNode = &branch->child[pos];
          ++hashPos;
        } else {
          // extremely unlikely that the new branch node only gets one
          // child in that case create it and defer the insertion into
          // the next depth
          branch->child[0] = leaf;
          insertNode = &branch->child[0];
          ++hashPos;
          leaf->rehash(hashPos);
        }

        break;
      }
      case kBranchNode: {
        BranchNode* branch = insertNode->getBranchNode();

        int location =
            branch->occupation.num_set_until(get_hash_chunk(hash, hashPos));

        if (branch->occupation.test(get_hash_chunk(hash, hashPos))) {
          --location;
        } else {
          branch = addChildToBranchNode(branch, get_hash_chunk(hash, hashPos),
                                        location);

          branch->child[location] = nullptr;
          branch->occupation.set(get_hash_chunk(hash, hashPos));
        }

        *insertNode = branch;
        insertNode = &branch->child[location];
        ++hashPos;
      }
    }

    return insert_recurse(insertNode, hash, hashPos, entry);
  }